

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo5.cpp
# Opt level: O1

int64_t primecount::pi_lmo5(int64_t x,bool is_print)

{
  int iVar1;
  double dVar2;
  double dVar3;
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 res_00 [16];
  byte bVar4;
  uchar *puVar5;
  int *piVar6;
  bool bVar7;
  uint64_t uVar8;
  long lVar9;
  long lVar10;
  uint *puVar11;
  int *piVar12;
  uint *puVar13;
  uint64_t uVar14;
  long *plVar15;
  int iVar16;
  long res;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint64_t prime;
  uint64_t uVar25;
  uint64_t i;
  ulong uVar26;
  uint64_t uVar27;
  ulong uVar28;
  uint64_t uVar29;
  ulong uVar30;
  uint *puVar31;
  int64_t iVar32;
  string_view_t str;
  string_view_t str_00;
  string_view_t str_01;
  string_view_t str_02;
  string_view_t str_03;
  string_view_t str_04;
  string_view_t str_05;
  type primes;
  Vector<int,_std::allocator<int>_> pi;
  Vector<int,_std::allocator<int>_> mu;
  Vector<int,_std::allocator<int>_> lpf;
  uint64_t in_stack_fffffffffffffdd8;
  long in_stack_fffffffffffffde0;
  Vector<int,_std::allocator<int>_> local_1d8;
  ulong local_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint *local_1a0;
  long *local_198;
  int64_t local_190;
  long *local_188;
  int *local_180;
  Vector<long,_std::allocator<long>_> local_178;
  long local_160;
  uint *local_158;
  uint64_t local_150;
  uint64_t local_148;
  Sieve local_140;
  Vector<int,_std::allocator<int>_> local_b0;
  double local_98;
  long local_90;
  int64_t local_88;
  ulong local_80;
  uint64_t local_78;
  long local_70;
  long local_68;
  Vector<int,_std::allocator<int>_> local_60;
  Vector<int,_std::allocator<int>_> local_48;
  char *extraout_RDX;
  
  if (x < 2) {
    iVar32 = 0;
  }
  else {
    x_00._8_8_ = in_stack_fffffffffffffde0;
    x_00._0_8_ = in_stack_fffffffffffffdd8;
    dVar2 = get_alpha_lmo((primecount *)x,(maxint_t)x_00);
    dVar3 = cbrt((double)x);
    uVar17 = (ulong)dVar3;
    if (0 < (long)uVar17) {
      do {
        if (uVar17 * uVar17 - (ulong)x / uVar17 == 0 ||
            (long)(uVar17 * uVar17) < (long)((ulong)x / uVar17)) goto LAB_0011becf;
        bVar7 = 1 < (long)uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar7);
      uVar17 = 0;
    }
LAB_0011becf:
    lVar18 = uVar17 - 1;
    do {
      lVar9 = lVar18 + 2;
      lVar18 = lVar18 + 1;
    } while (lVar9 * lVar9 - x / lVar9 == 0 || lVar9 * lVar9 < x / lVar9);
    puVar31 = (uint *)(long)(dVar2 * (double)lVar18);
    local_1c0 = 8;
    if (puVar31 < (uint *)0x14) {
      local_1c0 = (ulong)(byte)puVar31[0x5488f];
    }
    if (is_print) {
      str._M_str = (char *)(x % (long)puVar31);
      str._M_len = (size_t)"";
      print((primecount *)0x0,str);
      str_00._M_str = extraout_RDX;
      str_00._M_len = (size_t)"=== pi_lmo5(x) ===";
      print((primecount *)0x12,str_00);
      str_01._M_str = extraout_RDX_00;
      str_01._M_len = (size_t)"pi(x) = S1 + S2 + pi(y) - 1 - P2";
      print((primecount *)0x20,str_01);
      x_01._8_8_ = in_stack_fffffffffffffde0;
      x_01._0_8_ = in_stack_fffffffffffffdd8;
      print((primecount *)x,(maxint_t)x_01,0,(int64_t)puVar31,x / (long)puVar31,(int)local_1c0);
    }
    generate_primes_i32(&local_1d8,(int64_t)puVar31);
    generate_lpf(&local_48,(int64_t)puVar31);
    generate_moebius(&local_60,(int64_t)puVar31);
    lVar18 = (long)local_1d8.end_ - (long)local_1d8.array_;
    bVar7 = primecount::is_print();
    lVar18 = (lVar18 >> 2) + -1;
    local_80 = P2(x,(int64_t)puVar31,lVar18,1,bVar7);
    local_88 = S1(x,(int64_t)puVar31,local_1c0,1,is_print);
    if (is_print) {
      str_02._M_str = extraout_RDX_01;
      str_02._M_len = (size_t)"";
      print((primecount *)0x0,str_02);
      str_03._M_str = extraout_RDX_02;
      str_03._M_len = (size_t)"=== S2(x, y) ===";
      print((primecount *)0x10,str_03);
      str_04._M_str = extraout_RDX_03;
      str_04._M_len = (size_t)"Algorithm: POPCNT64 bit counting";
      print((primecount *)0x20,str_04);
      local_98 = get_time();
    }
    uVar8 = x / (long)puVar31;
    dVar2 = (double)(long)uVar8;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    uVar25 = 0xb504f333;
    if ((long)dVar2 < 0xb504f333) {
      uVar25 = (long)dVar2;
    }
    if ((long)uVar8 < (long)(uVar25 * uVar25)) {
      do {
        uVar25 = uVar25 - 1;
      } while (uVar25 * uVar25 - uVar8 != 0 && (long)uVar8 <= (long)(uVar25 * uVar25));
    }
    else {
      lVar9 = uVar25 * 2;
      if (lVar9 < (long)(uVar8 - uVar25 * uVar25)) {
        do {
          uVar25 = uVar25 + 1;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)(uVar8 - uVar25 * uVar25));
      }
    }
    uVar25 = Sieve::align_segment_size(uVar25);
    Sieve::Sieve(&local_140,0,uVar25,(long)local_1d8.end_ - (long)local_1d8.array_ >> 2);
    generate_pi(&local_b0,(int64_t)puVar31);
    local_178.array_ = (long *)0x0;
    local_178.end_ = (long *)0x0;
    local_178.capacity_ = (long *)0x0;
    Vector<long,_std::allocator<long>_>::resize
              (&local_178,(long)local_1d8.end_ - (long)local_1d8.array_ >> 2);
    if (local_178.array_ != local_178.end_) {
      memset(local_178.array_,0,(long)local_178.end_ - (long)local_178.array_ & 0xfffffffffffffff8);
    }
    dVar2 = (double)(long)puVar31;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    lVar9 = 0xb504f333;
    if ((long)dVar2 < 0xb504f333) {
      lVar9 = (long)dVar2;
    }
    if ((long)puVar31 < lVar9 * lVar9) {
      do {
        lVar9 = lVar9 + -1;
      } while (lVar9 * lVar9 - (long)puVar31 != 0 && (long)puVar31 <= lVar9 * lVar9);
    }
    else {
      lVar24 = lVar9 * 2;
      if (lVar24 < (long)puVar31 - lVar9 * lVar9) {
        do {
          lVar9 = lVar9 + 1;
          lVar24 = lVar24 + 2;
        } while (lVar24 < (long)puVar31 - lVar9 * lVar9);
      }
    }
    local_90 = lVar18;
    if ((long)uVar8 < 1) {
      lVar9 = 0;
    }
    else {
      local_68 = (long)local_b0.array_[lVar9];
      local_160 = (long)local_b0.array_[(long)puVar31];
      lVar18 = 0;
      local_78 = 0;
      lVar9 = 0;
      local_1b8 = uVar25;
      local_190 = x;
      local_158 = puVar31;
      do {
        uVar17 = local_1c0;
        uVar25 = local_78 + uVar25;
        local_148 = uVar25;
        if ((long)uVar8 < (long)uVar25) {
          local_148 = uVar8;
        }
        local_150 = 1;
        if (1 < (long)local_78) {
          local_150 = local_78;
        }
        uVar27 = local_78;
        local_78 = uVar25;
        Sieve::pre_sieve<int>(&local_140,&local_1d8,local_1c0,uVar27,local_148);
        uVar25 = local_1b8;
        in_stack_fffffffffffffdd8 = uVar27;
        in_stack_fffffffffffffde0 = lVar18;
        do {
          piVar6 = local_48.array_;
          puVar13 = local_140.counter_.counter.array_;
          puVar5 = local_140.sieve_.array_;
          bVar4 = (anonymous_namespace)::cpu_supports_popcnt;
          i = uVar17 + 1;
          if (local_68 <= (long)uVar17) {
            if ((long)i < local_160) {
              do {
                uVar29 = local_140.counter_.dist;
                puVar5 = local_140.sieve_.array_;
                bVar4 = (anonymous_namespace)::cpu_supports_popcnt;
                iVar1 = local_1d8.array_[i];
                prime = (uint64_t)iVar1;
                puVar13 = (uint *)(x / (long)(local_150 * prime));
                if ((long)puVar31 <= (long)puVar13) {
                  puVar13 = puVar31;
                }
                lVar24 = (long)local_b0.array_[(long)puVar13];
                uVar14 = x / (long)(local_148 * prime);
                uVar20 = prime;
                if ((long)prime < (long)uVar14) {
                  uVar20 = uVar14;
                }
                local_180 = local_1d8.array_;
                iVar16 = local_1d8.array_[lVar24];
                uVar21 = (uint64_t)iVar16;
                if (iVar1 < iVar16) {
                  local_1b0 = uVar21;
                  if ((long)uVar14 < (long)uVar21) {
                    local_1a0 = local_140.counter_.counter.array_;
                    local_188 = local_178.array_;
                    local_1a8 = -local_140.counter_.dist;
                    do {
                      plVar15 = (long *)(x / (long)(uVar21 * prime));
                      uVar17 = (long)plVar15 - uVar27;
                      uVar19 = local_140.prev_stop_ + 1;
                      local_140.prev_stop_ = uVar17;
                      if (uVar19 <= uVar17) {
                        if (local_140.counter_.stop <= uVar17) {
                          do {
                            local_140.counter_.stop = local_140.counter_.stop + uVar29;
                            puVar31 = local_1a0 + local_140.counter_.i;
                            local_140.counter_.i = local_140.counter_.i + 1;
                            local_140.counter_.sum = local_140.counter_.sum + *puVar31;
                          } while (local_140.counter_.stop <= uVar17);
                          uVar19 = local_140.counter_.stop + local_1a8;
                          local_140.count_ = local_140.counter_.sum;
                        }
                        uVar30 = uVar19 / 0xf0;
                        uVar28 = uVar17 / 0xf0;
                        uVar26 = 0xffffffffffffffff;
                        if (uVar30 == uVar28) {
                          uVar26 = *(ulong *)(Sieve::unset_larger +
                                             (ulong)(uint)((int)uVar17 + (int)uVar28 * -0xf0) * 8);
                        }
                        uVar22 = 0;
                        if (uVar30 != uVar28) {
                          uVar22 = *(ulong *)(Sieve::unset_larger +
                                             (ulong)(uint)((int)uVar17 + (int)uVar28 * -0xf0) * 8);
                        }
                        uVar19 = uVar26 & *(ulong *)(Sieve::unset_smaller +
                                                    (ulong)(uint)((int)uVar19 + (int)uVar30 * -0xf0)
                                                    * 8) & *(ulong *)(puVar5 + uVar30 * 8);
                        uVar17 = *(ulong *)(puVar5 + uVar28 * 8);
                        local_198 = plVar15;
                        if ((bVar4 & 1) == 0) {
                          uVar27 = in_stack_fffffffffffffdd8;
                          lVar18 = in_stack_fffffffffffffde0;
                          uVar25 = anon_unknown.dwarf_92e6f::popcnt64_bitwise_noinline(uVar19);
                          in_stack_fffffffffffffdd8 = uVar27;
                          in_stack_fffffffffffffde0 = lVar18;
                        }
                        else {
                          uVar25 = POPCOUNT(uVar19);
                        }
                        if ((bVar4 & 1) == 0) {
                          uVar27 = in_stack_fffffffffffffdd8;
                          lVar18 = in_stack_fffffffffffffde0;
                          uVar14 = anon_unknown.dwarf_92e6f::popcnt64_bitwise_noinline
                                             (uVar22 & uVar17);
                          in_stack_fffffffffffffdd8 = uVar27;
                          in_stack_fffffffffffffde0 = lVar18;
                        }
                        else {
                          uVar14 = POPCOUNT(uVar22 & uVar17);
                        }
                        lVar10 = uVar14 + uVar25;
                        uVar30 = uVar30 + 1;
                        if (uVar30 < uVar28) {
                          uVar17 = (long)local_198 + lVar18;
                          do {
                            if ((bVar4 & 1) == 0) {
                              uVar27 = in_stack_fffffffffffffdd8;
                              lVar18 = in_stack_fffffffffffffde0;
                              uVar25 = anon_unknown.dwarf_92e6f::popcnt64_bitwise_noinline
                                                 (*(uint64_t *)(puVar5 + uVar30 * 8));
                              in_stack_fffffffffffffdd8 = uVar27;
                              in_stack_fffffffffffffde0 = lVar18;
                            }
                            else {
                              uVar25 = POPCOUNT(*(uint64_t *)(puVar5 + uVar30 * 8));
                            }
                            lVar10 = lVar10 + uVar25;
                            uVar30 = uVar30 + 1;
                          } while (uVar17 / 0xf0 != uVar30);
                        }
                        local_140.count_ = lVar10 + local_140.count_;
                        x = local_190;
                      }
                      lVar9 = lVar9 + local_140.count_ + local_188[i];
                      uVar21 = (uint64_t)local_180[lVar24 + -1];
                      lVar24 = lVar24 + -1;
                    } while ((long)uVar20 < (long)uVar21);
                  }
                  lVar18 = in_stack_fffffffffffffde0;
                  uVar27 = in_stack_fffffffffffffdd8;
                  local_178.array_[i] = local_178.array_[i] + local_140.total_count_;
                  Sieve::cross_off_count(&local_140,prime,i);
                  iVar16 = (int)local_1b0;
                  puVar31 = local_158;
                  uVar25 = local_1b8;
                  in_stack_fffffffffffffdd8 = uVar27;
                  in_stack_fffffffffffffde0 = lVar18;
                }
              } while ((iVar1 < iVar16) && (i = i + 1, (long)i < local_160));
            }
            break;
          }
          uVar29 = (uint64_t)local_1d8.array_[i];
          lVar10 = x / (long)(local_148 * uVar29);
          lVar24 = (long)puVar31 / (long)uVar29;
          if ((long)puVar31 / (long)uVar29 < lVar10) {
            lVar24 = lVar10;
          }
          puVar11 = (uint *)(x / (long)(local_150 * uVar29));
          if ((long)puVar31 <= (long)puVar11) {
            puVar11 = puVar31;
          }
          local_1a0 = puVar11;
          if ((long)uVar29 < (long)puVar11) {
            if (lVar24 < (long)puVar11) {
              local_198 = local_178.array_;
              local_1b0 = local_140.counter_.dist;
              local_70 = -local_140.counter_.dist;
              local_188 = (long *)local_60.array_;
              plVar15 = (long *)local_60.array_;
              x = local_190;
              local_1a8 = uVar29;
              do {
                piVar12 = (int *)(long)*(int *)((long)plVar15 + (long)puVar11 * 4);
                if ((piVar12 != (int *)0x0) && ((int)uVar29 < piVar6[(long)puVar11])) {
                  lVar10 = x / (long)((long)puVar11 * uVar29);
                  uVar19 = lVar10 - uVar27;
                  uVar17 = local_140.prev_stop_ + 1;
                  local_180 = piVar12;
                  local_140.prev_stop_ = uVar19;
                  if (uVar17 <= uVar19) {
                    if (local_140.counter_.stop <= uVar19) {
                      do {
                        local_140.counter_.stop = local_140.counter_.stop + local_1b0;
                        puVar31 = puVar13 + local_140.counter_.i;
                        local_140.counter_.i = local_140.counter_.i + 1;
                        local_140.counter_.sum = local_140.counter_.sum + *puVar31;
                      } while (local_140.counter_.stop <= uVar19);
                      uVar17 = local_140.counter_.stop + local_70;
                      local_140.count_ = local_140.counter_.sum;
                    }
                    uVar28 = uVar17 / 0xf0;
                    uVar30 = uVar19 / 0xf0;
                    uVar26 = 0xffffffffffffffff;
                    if (uVar28 == uVar30) {
                      uVar26 = *(ulong *)(Sieve::unset_larger +
                                         (ulong)(uint)((int)uVar19 + (int)uVar30 * -0xf0) * 8);
                    }
                    uVar22 = 0;
                    if (uVar28 != uVar30) {
                      uVar22 = *(ulong *)(Sieve::unset_larger +
                                         (ulong)(uint)((int)uVar19 + (int)uVar30 * -0xf0) * 8);
                    }
                    uVar19 = uVar26 & *(ulong *)(Sieve::unset_smaller +
                                                (ulong)(uint)((int)uVar17 + (int)uVar28 * -0xf0) * 8
                                                ) & *(ulong *)(puVar5 + uVar28 * 8);
                    uVar17 = *(ulong *)(puVar5 + uVar30 * 8);
                    if ((bVar4 & 1) == 0) {
                      uVar27 = in_stack_fffffffffffffdd8;
                      lVar18 = in_stack_fffffffffffffde0;
                      uVar25 = anon_unknown.dwarf_92e6f::popcnt64_bitwise_noinline(uVar19);
                      in_stack_fffffffffffffdd8 = uVar27;
                      in_stack_fffffffffffffde0 = lVar18;
                    }
                    else {
                      uVar25 = POPCOUNT(uVar19);
                    }
                    if ((bVar4 & 1) == 0) {
                      uVar27 = in_stack_fffffffffffffdd8;
                      lVar18 = in_stack_fffffffffffffde0;
                      uVar29 = anon_unknown.dwarf_92e6f::popcnt64_bitwise_noinline(uVar22 & uVar17);
                      in_stack_fffffffffffffdd8 = uVar27;
                      in_stack_fffffffffffffde0 = lVar18;
                    }
                    else {
                      uVar29 = POPCOUNT(uVar22 & uVar17);
                    }
                    lVar23 = uVar29 + uVar25;
                    uVar28 = uVar28 + 1;
                    if (uVar28 < uVar30) {
                      uVar17 = lVar10 + lVar18;
                      do {
                        if ((bVar4 & 1) == 0) {
                          uVar27 = in_stack_fffffffffffffdd8;
                          lVar18 = in_stack_fffffffffffffde0;
                          uVar25 = anon_unknown.dwarf_92e6f::popcnt64_bitwise_noinline
                                             (*(uint64_t *)(puVar5 + uVar28 * 8));
                          in_stack_fffffffffffffdd8 = uVar27;
                          in_stack_fffffffffffffde0 = lVar18;
                        }
                        else {
                          uVar25 = POPCOUNT(*(uint64_t *)(puVar5 + uVar28 * 8));
                        }
                        lVar23 = lVar23 + uVar25;
                        uVar28 = uVar28 + 1;
                      } while (uVar17 / 0xf0 != uVar28);
                    }
                    local_140.count_ = lVar23 + local_140.count_;
                    x = local_190;
                    uVar29 = local_1a8;
                  }
                  lVar9 = lVar9 - (local_140.count_ + local_198[i]) * (long)local_180;
                  plVar15 = local_188;
                }
                puVar11 = (uint *)((long)puVar11 - 1);
              } while (lVar24 < (long)puVar11);
            }
            lVar18 = in_stack_fffffffffffffde0;
            uVar27 = in_stack_fffffffffffffdd8;
            local_178.array_[i] = local_178.array_[i] + local_140.total_count_;
            Sieve::cross_off_count(&local_140,uVar29,i);
            puVar31 = local_158;
            uVar25 = local_1b8;
            in_stack_fffffffffffffdd8 = uVar27;
            in_stack_fffffffffffffde0 = lVar18;
          }
          uVar17 = i;
        } while ((long)uVar29 < (long)local_1a0);
        lVar18 = lVar18 - uVar25;
      } while ((long)local_78 < (long)uVar8);
    }
    if (is_print) {
      res_00._8_8_ = in_stack_fffffffffffffde0;
      res_00._0_8_ = in_stack_fffffffffffffdd8;
      str_05._M_str = "S2";
      str_05._M_len = 2;
      print(str_05,(maxint_t)res_00,local_98);
    }
    operator_delete(local_178.array_,(long)local_178.capacity_ - (long)local_178.array_);
    operator_delete(local_b0.array_,(long)local_b0.capacity_ - (long)local_b0.array_);
    operator_delete(local_140.counter_.counter.array_,
                    (long)local_140.counter_.counter.capacity_ -
                    (long)local_140.counter_.counter.array_);
    operator_delete(local_140.wheel_.array_,
                    (long)local_140.wheel_.capacity_ - (long)local_140.wheel_.array_);
    operator_delete(local_140.sieve_.array_,
                    (long)local_140.sieve_.capacity_ - (long)local_140.sieve_.array_);
    iVar32 = local_88 + lVar9 + local_90 + ~local_80;
    operator_delete(local_60.array_,(long)local_60.capacity_ - (long)local_60.array_);
    operator_delete(local_48.array_,(long)local_48.capacity_ - (long)local_48.array_);
    operator_delete(local_1d8.array_,(long)local_1d8.capacity_ - (long)local_1d8.array_);
  }
  return iVar32;
}

Assistant:

int64_t pi_lmo5(int64_t x, bool is_print)
{
  if (x < 2)
    return 0;

  int threads = 1;
  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  if (is_print)
  {
    print("");
    print("=== pi_lmo5(x) ===");
    print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
    print(x, y, z, c, threads);
  }

  auto primes = generate_primes<int32_t>(y);
  auto lpf = generate_lpf(y);
  auto mu = generate_moebius(y);

  int64_t pi_y = primes.size() - 1;
  int64_t p2 = P2(x, y, pi_y, threads);
  int64_t s1 = S1(x, y, c, threads, is_print);
  int64_t s2 = S2(x, y, c, primes, lpf, mu, is_print);
  int64_t phi = s1 + s2;
  int64_t sum = phi + pi_y - 1 - p2;

  return sum;
}